

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles2::Functional::UniformCase::getActiveUniforms
          (UniformCase *this,
          vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
          *basicUniformReportsDst,
          vector<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
          *basicUniformReportsRef,deUint32 programGL)

{
  int iVar1;
  size_t __n;
  GLint GVar2;
  GLsizei GVar3;
  pointer pcVar4;
  bool bVar5;
  GLenum GVar6;
  DataType dataType;
  deBool dVar7;
  int iVar8;
  size_t sVar9;
  char *pcVar10;
  pointer pBVar11;
  long *plVar12;
  undefined8 *puVar13;
  TestError *this_00;
  long *plVar14;
  ulong *puVar15;
  GLuint index;
  pointer pcVar16;
  pointer pBVar17;
  ulong uVar18;
  pointer pBVar19;
  uint uVar20;
  size_type *psVar21;
  TestLog *pTVar22;
  CallLogWrapper *this_01;
  long lVar23;
  bool bVar24;
  bool bVar25;
  GLint reportedSize;
  GLsizei reportedNameLength;
  GLint uniformMaxNameLength;
  vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
  *local_460;
  GLint numActiveUniforms;
  string reportedNameStr;
  GLenum reportedTypeGL;
  TestLog *local_420;
  long *local_418;
  undefined8 local_410;
  long local_408;
  undefined8 uStack_400;
  ulong *local_3f8;
  long local_3f0;
  ulong local_3e8;
  long lStack_3e0;
  long *local_3d8;
  long local_3d0;
  long local_3c8;
  long lStack_3c0;
  ulong *local_3b8;
  long local_3b0;
  ulong local_3a8 [2];
  vector<char,_std::allocator<char>_> nameBuffer;
  long *local_370;
  long local_368;
  long local_360;
  long lStack_358;
  pointer local_350;
  long *local_348 [2];
  long local_338 [2];
  undefined1 local_328 [8];
  undefined1 local_320 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  GLsizei local_308;
  GLint local_304;
  DataType local_300;
  GLuint local_2fc;
  ios_base local_2b0 [264];
  allocator<char> local_1a8 [112];
  ios_base local_138 [264];
  
  pTVar22 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  numActiveUniforms = 0;
  uniformMaxNameLength = 0;
  nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_01 = &this->super_CallLogWrapper;
  local_460 = basicUniformReportsDst;
  glu::CallLogWrapper::glGetProgramiv(this_01,programGL,0x8b86,&numActiveUniforms);
  GVar6 = glu::CallLogWrapper::glGetError(this_01);
  glu::checkError(GVar6,"glGetProgramiv(programGL, GL_ACTIVE_UNIFORMS, &numActiveUniforms)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                  ,0x4f5);
  local_328 = (undefined1  [8])pTVar22;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"// Number of active uniforms reported: ",0x27);
  std::ostream::operator<<((ostringstream *)local_320,numActiveUniforms);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  glu::CallLogWrapper::glGetProgramiv(this_01,programGL,0x8b87,&uniformMaxNameLength);
  GVar6 = glu::CallLogWrapper::glGetError(this_01);
  glu::checkError(GVar6,
                  "glGetProgramiv(programGL, GL_ACTIVE_UNIFORM_MAX_LENGTH, &uniformMaxNameLength)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                  ,0x4f7);
  local_328 = (undefined1  [8])pTVar22;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"// Maximum uniform name length reported: ",0x29);
  std::ostream::operator<<((ostringstream *)local_320,uniformMaxNameLength);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  std::vector<char,_std::allocator<char>_>::resize(&nameBuffer,(long)uniformMaxNameLength);
  local_420 = pTVar22;
  if (numActiveUniforms < 1) {
    bVar5 = true;
LAB_00f8c8b8:
    pBVar19 = (basicUniformReportsRef->
              super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(basicUniformReportsRef->
                                super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar19) >> 4) *
            -0x55555555) {
      lVar23 = 0;
      do {
        if (pBVar19[lVar23].isUsedInShader == true) {
          pBVar17 = (local_460->
                    super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pBVar11 = (local_460->
                    super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          if (pBVar17 != pBVar11) {
            do {
              pBVar11 = pBVar17;
              iVar8 = std::__cxx11::string::compare((char *)pBVar11);
              if (iVar8 == 0) break;
              pBVar17 = pBVar11 + 1;
              pBVar11 = (local_460->
                        super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            } while (pBVar17 != pBVar11);
          }
          if (pBVar11 ==
              (local_460->
              super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            local_328 = (undefined1  [8])local_420;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,"// FAILURE: uniform with name ",0x1e);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,pBVar19[lVar23].name._M_dataplus._M_p,
                       pBVar19[lVar23].name._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320," was not reported by GL",0x17);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
            std::ios_base::~ios_base(local_2b0);
            bVar5 = false;
          }
        }
        lVar23 = lVar23 + 1;
        pBVar19 = (basicUniformReportsRef->
                  super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (lVar23 < (int)((ulong)((long)(basicUniformReportsRef->
                                            super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pBVar19) >> 4) * -0x55555555);
    }
    if (nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return bVar5;
  }
  bVar5 = true;
  index = 0;
LAB_00f8be09:
  reportedNameLength = 0;
  reportedSize = -1;
  reportedTypeGL = 0;
  glu::CallLogWrapper::glGetActiveUniform
            (this_01,programGL,index,uniformMaxNameLength,&reportedNameLength,&reportedSize,
             &reportedTypeGL,
             nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  GVar6 = glu::CallLogWrapper::glGetError(this_01);
  glu::checkError(GVar6,
                  "glGetActiveUniform(programGL, (GLuint)unifNdx, (GLsizei)uniformMaxNameLength, &reportedNameLength, &reportedSize, &reportedTypeGL, &nameBuffer[0])"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                  ,0x501);
  dataType = glu::getDataTypeFromGLType(reportedTypeGL);
  pcVar4 = nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  reportedNameStr._M_dataplus._M_p = (pointer)&reportedNameStr.field_2;
  if (nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start == (pointer)0x0) {
    pcVar16 = &DAT_00000001;
  }
  else {
    sVar9 = strlen(nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
    pcVar16 = pcVar4 + sVar9;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&reportedNameStr,pcVar4,pcVar16);
  if (dataType == TYPE_LAST) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid uniform type","reportedType != glu::TYPE_LAST",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
               ,0x506);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_328 = (undefined1  [8])pTVar22;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"// Got name = ",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,reportedNameStr._M_dataplus._M_p,
             CONCAT44(reportedNameStr._M_string_length._4_4_,(int)reportedNameStr._M_string_length))
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,", name length = ",0x10);
  std::ostream::operator<<((ostringstream *)local_320,reportedNameLength);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,", size = ",9);
  std::ostream::operator<<((ostringstream *)local_320,reportedSize);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,", type = ",9);
  pcVar10 = glu::getDataTypeName(dataType);
  if (pcVar10 == (char *)0x0) {
    std::ios::clear((int)local_320 + (int)*(_func_int **)((long)local_320 + -0x18));
  }
  else {
    sVar9 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar10,sVar9);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  if (reportedNameLength != (int)reportedNameStr._M_string_length) {
    local_328 = (undefined1  [8])pTVar22;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"// FAILURE: wrong name length reported, should be ",0x32);
    std::ostream::_M_insert<unsigned_long>((ulong)local_320);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    bVar5 = false;
  }
  dVar7 = deStringBeginsWith(reportedNameStr._M_dataplus._M_p,"gl_");
  if (dVar7 == 0) {
    pBVar19 = (basicUniformReportsRef->
              super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar20 = (int)((long)(basicUniformReportsRef->
                         super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar19 >> 4) *
             -0x55555555;
    bVar24 = 0 < (int)uVar20;
    if (0 < (int)uVar20) {
      local_350 = reportedNameStr._M_dataplus._M_p;
      sVar9 = CONCAT44(reportedNameStr._M_string_length._4_4_,(int)reportedNameStr._M_string_length)
      ;
      psVar21 = &(pBVar19->name)._M_string_length;
      lVar23 = 0;
      uVar18 = 1;
      do {
        __n = *psVar21;
        if ((__n == sVar9) &&
           ((__n == 0 ||
            (iVar8 = bcmp((((string *)(psVar21 + -1))->_M_dataplus)._M_p,local_350,__n), iVar8 == 0)
            ))) {
          if (bVar24) {
            pBVar17 = (local_460->
                      super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pBVar11 = (local_460->
                      super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            if (pBVar17 != pBVar11) goto LAB_00f8c145;
            goto LAB_00f8c220;
          }
          break;
        }
        bVar24 = uVar18 < (uVar20 & 0x7fffffff);
        lVar23 = lVar23 + 0x100000000;
        psVar21 = psVar21 + 6;
        bVar25 = uVar18 != (uVar20 & 0x7fffffff);
        uVar18 = uVar18 + 1;
      } while (bVar25);
    }
    pTVar22 = local_420;
    local_328 = (undefined1  [8])local_420;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"// FAILURE: invalid non-built-in uniform name reported",0x36);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    goto LAB_00f8c1c8;
  }
  goto LAB_00f8c1f1;
  while( true ) {
    pBVar17 = pBVar11 + 1;
    pBVar11 = (local_460->
              super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pBVar17 == pBVar11) break;
LAB_00f8c145:
    pBVar11 = pBVar17;
    iVar8 = std::__cxx11::string::compare((char *)pBVar11);
    if (iVar8 == 0) break;
  }
LAB_00f8c220:
  pTVar22 = local_420;
  if (pBVar11 !=
      (local_460->
      super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_328 = (undefined1  [8])local_420;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"// FAILURE: same uniform name reported twice",0x2c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    bVar5 = false;
  }
  GVar3 = reportedNameLength;
  GVar2 = reportedSize;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_328,reportedNameStr._M_dataplus._M_p,local_1a8);
  local_308 = GVar3;
  local_304 = GVar2;
  local_300 = dataType;
  local_2fc = index;
  std::
  vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
  ::emplace_back<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>
            (local_460,(BasicUniformReportGL *)local_328);
  if (local_328 != (undefined1  [8])(local_320 + 8)) {
    operator_delete((void *)local_328,local_318._M_allocated_capacity + 1);
  }
  lVar23 = lVar23 >> 0x20;
  if (dataType != pBVar19[lVar23].type) {
    local_328 = (undefined1  [8])pTVar22;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"// FAILURE: wrong type reported, should be ",0x2b);
    pcVar10 = glu::getDataTypeName(pBVar19[lVar23].type);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)local_320 + (int)*(_func_int **)((long)local_320 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar10,sVar9);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    bVar5 = false;
  }
  if ((pBVar19[lVar23].minSize <= reportedSize) && (reportedSize <= pBVar19[lVar23].maxSize))
  goto LAB_00f8c1f1;
  local_328 = (undefined1  [8])pTVar22;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"// FAILURE: wrong size reported, should be ",0x2b);
  iVar8 = pBVar19[lVar23].minSize;
  iVar1 = pBVar19[lVar23].maxSize;
  if (iVar8 == iVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<((ostringstream *)local_1a8,pBVar19[lVar23].minSize);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<((ostringstream *)local_1a8,pBVar19[lVar23].minSize);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar12 = (long *)std::__cxx11::string::replace((ulong)local_348,0,(char *)0x0,0x1c65e86);
    local_370 = &local_360;
    plVar14 = plVar12 + 2;
    if ((long *)*plVar12 == plVar14) {
      local_360 = *plVar14;
      lStack_358 = plVar12[3];
    }
    else {
      local_360 = *plVar14;
      local_370 = (long *)*plVar12;
    }
    local_368 = plVar12[1];
    *plVar12 = (long)plVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_370);
    local_3f8 = &local_3e8;
    puVar15 = (ulong *)(plVar12 + 2);
    if ((ulong *)*plVar12 == puVar15) {
      local_3e8 = *puVar15;
      lStack_3e0 = plVar12[3];
    }
    else {
      local_3e8 = *puVar15;
      local_3f8 = (ulong *)*plVar12;
    }
    local_3f0 = plVar12[1];
    *plVar12 = (long)puVar15;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<((ostringstream *)local_1a8,pBVar19[lVar23].maxSize);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar18 = 0xf;
    if (local_3f8 != &local_3e8) {
      uVar18 = local_3e8;
    }
    if (uVar18 < (ulong)(local_3b0 + local_3f0)) {
      uVar18 = 0xf;
      if (local_3b8 != local_3a8) {
        uVar18 = local_3a8[0];
      }
      if (uVar18 < (ulong)(local_3b0 + local_3f0)) goto LAB_00f8c6b0;
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_3b8,0,(char *)0x0,(ulong)local_3f8);
    }
    else {
LAB_00f8c6b0:
      puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3f8,(ulong)local_3b8);
    }
    local_418 = &local_408;
    plVar12 = puVar13 + 2;
    if ((long *)*puVar13 == plVar12) {
      local_408 = *plVar12;
      uStack_400 = puVar13[3];
    }
    else {
      local_408 = *plVar12;
      local_418 = (long *)*puVar13;
    }
    local_410 = puVar13[1];
    *puVar13 = plVar12;
    puVar13[1] = 0;
    *(undefined1 *)plVar12 = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_418);
    local_3d8 = &local_3c8;
    plVar14 = plVar12 + 2;
    if ((long *)*plVar12 == plVar14) {
      local_3c8 = *plVar14;
      lStack_3c0 = plVar12[3];
    }
    else {
      local_3c8 = *plVar14;
      local_3d8 = (long *)*plVar12;
    }
    local_3d0 = plVar12[1];
    *plVar12 = (long)plVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,(char *)local_3d8,local_3d0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_3d8 != &local_3c8) {
    operator_delete(local_3d8,local_3c8 + 1);
  }
  pTVar22 = local_420;
  if (iVar8 != iVar1) {
    if (local_418 != &local_408) {
      operator_delete(local_418,local_408 + 1);
    }
    if (local_3b8 != local_3a8) {
      operator_delete(local_3b8,local_3a8[0] + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_370 != &local_360) {
      operator_delete(local_370,local_360 + 1);
    }
    if (local_348[0] != local_338) {
      operator_delete(local_348[0],local_338[0] + 1);
    }
  }
LAB_00f8c1c8:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  bVar5 = false;
LAB_00f8c1f1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)reportedNameStr._M_dataplus._M_p != &reportedNameStr.field_2) {
    operator_delete(reportedNameStr._M_dataplus._M_p,
                    reportedNameStr.field_2._M_allocated_capacity + 1);
  }
  index = index + 1;
  if (numActiveUniforms <= (int)index) goto LAB_00f8c8b8;
  goto LAB_00f8be09;
}

Assistant:

bool UniformCase::getActiveUniforms (vector<BasicUniformReportGL>& basicUniformReportsDst, const vector<BasicUniformReportRef>& basicUniformReportsRef, const deUint32 programGL)
{
	TestLog&			log						= m_testCtx.getLog();
	GLint				numActiveUniforms		= 0;
	GLint				uniformMaxNameLength	= 0;
	vector<char>		nameBuffer;
	bool				success					= true;

	GLU_CHECK_CALL(glGetProgramiv(programGL, GL_ACTIVE_UNIFORMS, &numActiveUniforms));
	log << TestLog::Message << "// Number of active uniforms reported: " << numActiveUniforms << TestLog::EndMessage;
	GLU_CHECK_CALL(glGetProgramiv(programGL, GL_ACTIVE_UNIFORM_MAX_LENGTH, &uniformMaxNameLength));
	log << TestLog::Message << "// Maximum uniform name length reported: " << uniformMaxNameLength << TestLog::EndMessage;
	nameBuffer.resize(uniformMaxNameLength);

	for (int unifNdx = 0; unifNdx < numActiveUniforms; unifNdx++)
	{
		GLsizei					reportedNameLength	= 0;
		GLint					reportedSize		= -1;
		GLenum					reportedTypeGL		= GL_NONE;

		GLU_CHECK_CALL(glGetActiveUniform(programGL, (GLuint)unifNdx, (GLsizei)uniformMaxNameLength, &reportedNameLength, &reportedSize, &reportedTypeGL, &nameBuffer[0]));

		const glu::DataType		reportedType		= glu::getDataTypeFromGLType(reportedTypeGL);
		const string			reportedNameStr		(&nameBuffer[0]);

		TCU_CHECK_MSG(reportedType != glu::TYPE_LAST, "Invalid uniform type");

		log << TestLog::Message << "// Got name = " << reportedNameStr << ", name length = " << reportedNameLength << ", size = " << reportedSize << ", type = " << glu::getDataTypeName(reportedType) << TestLog::EndMessage;

		if ((GLsizei)reportedNameStr.length() != reportedNameLength)
		{
			log << TestLog::Message << "// FAILURE: wrong name length reported, should be " << reportedNameStr.length() << TestLog::EndMessage;
			success = false;
		}

		if (!deStringBeginsWith(reportedNameStr.c_str(), "gl_")) // Ignore built-in uniforms.
		{
			int referenceNdx;
			for (referenceNdx = 0; referenceNdx < (int)basicUniformReportsRef.size(); referenceNdx++)
			{
				if (basicUniformReportsRef[referenceNdx].name == reportedNameStr)
					break;
			}

			if (referenceNdx >= (int)basicUniformReportsRef.size())
			{
				log << TestLog::Message << "// FAILURE: invalid non-built-in uniform name reported" << TestLog::EndMessage;
				success = false;
			}
			else
			{
				const BasicUniformReportRef& reference = basicUniformReportsRef[referenceNdx];

				DE_ASSERT(reference.type != glu::TYPE_LAST);
				DE_ASSERT(reference.minSize >= 1 || (reference.minSize == 0 && !reference.isUsedInShader));
				DE_ASSERT(reference.minSize <= reference.maxSize);

				if (BasicUniformReportGL::findWithName(basicUniformReportsDst, reportedNameStr.c_str()) != basicUniformReportsDst.end())
				{
					log << TestLog::Message << "// FAILURE: same uniform name reported twice" << TestLog::EndMessage;
					success = false;
				}

				basicUniformReportsDst.push_back(BasicUniformReportGL(reportedNameStr.c_str(), reportedNameLength, reportedSize, reportedType, unifNdx));

				if (reportedType != reference.type)
				{
					log << TestLog::Message << "// FAILURE: wrong type reported, should be " << glu::getDataTypeName(reference.type) << TestLog::EndMessage;
					success = false;
				}
				if (reportedSize < reference.minSize || reportedSize > reference.maxSize)
				{
					log << TestLog::Message
						<< "// FAILURE: wrong size reported, should be "
						<< (reference.minSize == reference.maxSize ? de::toString(reference.minSize) : "in the range [" + de::toString(reference.minSize) + ", " + de::toString(reference.maxSize) + "]")
						<< TestLog::EndMessage;

					success = false;
				}
			}
		}
	}

	for (int i = 0; i < (int)basicUniformReportsRef.size(); i++)
	{
		const BasicUniformReportRef& expected = basicUniformReportsRef[i];
		if (expected.isUsedInShader && BasicUniformReportGL::findWithName(basicUniformReportsDst, expected.name.c_str()) == basicUniformReportsDst.end())
		{
			log << TestLog::Message << "// FAILURE: uniform with name " << expected.name << " was not reported by GL" << TestLog::EndMessage;
			success = false;
		}
	}

	return success;
}